

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O3

MPP_RET h264d_init(void *decoder,ParserCfg *init)

{
  H264dInputCtx_t *p_Inp;
  h264d_cur_ctx_t *phVar1;
  H264dCurCtx_t *p_Cur;
  H264dVideoCtx_t *p_Vid;
  MppBufSlots pvVar2;
  bool bVar3;
  void *pvVar4;
  h264d_video_ctx_t *phVar5;
  RK_U8 *pRVar6;
  h264_store_pic_t **pphVar7;
  h264_dpb_buf_t *phVar8;
  MppMemPool pvVar9;
  void *pvVar10;
  char *pcVar11;
  bool bVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  if (decoder == (void *)0x0) {
    if ((h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x146);
    return MPP_OK;
  }
  memset(decoder,0,0xd8);
  mpp_env_get_u32("h264d_debug",&h264d_debug,1);
  pvVar2 = init->packet_slots;
  *(MppBufSlots *)((long)decoder + 0x68) = init->frame_slots;
  *(MppBufSlots *)((long)decoder + 0x70) = pvVar2;
  *(MppDecCfgSet **)((long)decoder + 0x78) = init->cfg;
  mpp_frame_init((MppFrame *)((long)decoder + 0x88));
  pvVar4 = mpp_osal_calloc("h264d_init",0x490);
  *(void **)((long)decoder + 0x38) = pvVar4;
  pvVar4 = mpp_osal_calloc("h264d_init",0x21a0);
  *(void **)((long)decoder + 0x40) = pvVar4;
  phVar5 = (h264d_video_ctx_t *)mpp_osal_calloc("h264d_init",0xd30);
  *(h264d_video_ctx_t **)((long)decoder + 0x48) = phVar5;
  p_Inp = *(H264dInputCtx_t **)((long)decoder + 0x38);
  if ((p_Inp == (H264dInputCtx_t *)0x0) ||
     (phVar1 = *(h264d_cur_ctx_t **)((long)decoder + 0x40),
     phVar5 == (h264d_video_ctx_t *)0x0 || phVar1 == (h264d_cur_ctx_t *)0x0)) {
    if ((h264d_debug & 1) == 0) goto LAB_001895c3;
    pcVar11 = "malloc buffer error(%d).\n";
    uVar13 = 0x154;
  }
  else {
    p_Inp->p_Dec = (h264_dec_ctx_t *)decoder;
    p_Inp->p_Cur = phVar1;
    p_Inp->p_Vid = phVar5;
    phVar1->p_Dec = (h264_dec_ctx_t *)decoder;
    phVar1->p_Inp = p_Inp;
    phVar1->p_Vid = phVar5;
    phVar5->p_Dec = (h264_dec_ctx_t *)decoder;
    phVar5->p_Inp = p_Inp;
    phVar5->p_Cur = phVar1;
    *(MppDecHwCap **)((long)decoder + 0x80) = init->hw_info;
    open_stream_file(p_Inp,"/sdcard");
    if ((h264d_debug & 0x10000) != 0) {
      p_Inp->spspps_size = 0x100000;
      pRVar6 = (RK_U8 *)mpp_osal_malloc("init_input_ctx",0x100000);
      p_Inp->spspps_buf = pRVar6;
      if (pRVar6 == (RK_U8 *)0x0) {
        if ((h264d_debug & 1) != 0) {
          _mpp_log_l(4,"h264d_api","malloc buffer error(%d).\n",(char *)0x0,0x42);
        }
        free_input_ctx(p_Inp);
        if ((h264d_debug & 4) == 0) goto LAB_001895c3;
        pcVar11 = "Function error(%d).\n";
        uVar13 = 0x161;
        goto LAB_001895bc;
      }
    }
    p_Cur = *(H264dCurCtx_t **)((long)decoder + 0x40);
    if (p_Cur == (H264dCurCtx_t *)0x0) {
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x6e);
      }
    }
    else {
      (p_Cur->strm).nalu_max_size = 0x200000;
      pRVar6 = (RK_U8 *)mpp_osal_malloc("init_cur_ctx",0x200000);
      (p_Cur->strm).nalu_buf = pRVar6;
      (p_Cur->strm).head_max_size = 0x100000;
      pRVar6 = (RK_U8 *)mpp_osal_malloc("init_cur_ctx",0x100000);
      (p_Cur->strm).head_buf = pRVar6;
      (p_Cur->strm).tmp_max_size = 0x100000;
      pRVar6 = (RK_U8 *)mpp_osal_malloc("init_cur_ctx",(ulong)(p_Cur->strm).head_max_size);
      (p_Cur->strm).tmp_buf = pRVar6;
      if (((p_Cur->strm).nalu_buf == (RK_U8 *)0x0) || ((p_Cur->strm).head_buf == (RK_U8 *)0x0)) {
        uVar13 = 0x77;
LAB_00189a62:
        if ((h264d_debug & 1) != 0) {
          _mpp_log_l(4,"h264d_api","malloc buffer error(%d).\n",(char *)0x0,uVar13);
        }
        free_cur_ctx(p_Cur);
        if ((h264d_debug & 4) == 0) goto LAB_001895c3;
        pcVar11 = "Function error(%d).\n";
        uVar13 = 0x162;
        goto LAB_001895bc;
      }
      (p_Cur->strm).prefixdata = 0xffffffff;
      lVar15 = 0;
      bVar3 = true;
      do {
        bVar12 = bVar3;
        pphVar7 = (h264_store_pic_t **)mpp_osal_malloc("init_cur_ctx",0x108);
        p_Cur->listP[lVar15] = pphVar7;
        pphVar7 = (h264_store_pic_t **)mpp_osal_malloc("init_cur_ctx",0x108);
        p_Cur->listB[lVar15] = pphVar7;
        if ((p_Cur->listP[lVar15] == (h264_store_pic_t **)0x0) ||
           (pphVar7 == (h264_store_pic_t **)0x0)) {
          uVar13 = 0x7c;
          goto LAB_00189a62;
        }
        lVar15 = 1;
        bVar3 = false;
      } while (bVar12);
      reset_cur_slice(p_Cur,&p_Cur->slice);
    }
    p_Vid = *(H264dVideoCtx_t **)((long)decoder + 0x48);
    if (p_Vid == (H264dVideoCtx_t *)0x0) {
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0xae);
      }
    }
    else {
      lVar15 = 0;
      bVar3 = true;
      do {
        bVar12 = bVar3;
        phVar8 = (h264_dpb_buf_t *)mpp_osal_calloc("init_vid_ctx",0x68);
        p_Vid->p_Dpb_layer[lVar15] = phVar8;
        if (phVar8 == (h264_dpb_buf_t *)0x0) {
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_api","malloc buffer error(%d).\n",(char *)0x0,0xb2);
          }
          free_vid_ctx(p_Vid);
          if ((h264d_debug & 4) == 0) goto LAB_001895c3;
          pcVar11 = "Function error(%d).\n";
          uVar13 = 0x163;
          goto LAB_001895bc;
        }
        phVar8->layer_id = (RK_S32)lVar15;
        phVar8->p_Vid = p_Vid;
        phVar8 = p_Vid->p_Dpb_layer[lVar15];
        phVar8->init_done = 0;
        phVar8->poc_interval = 2;
        lVar15 = 1;
        bVar3 = false;
      } while (bVar12);
      p_Vid->active_sps = (h264_sps_t *)0x0;
      p_Vid->active_subsps = (h264_subsps_t *)0x0;
      p_Vid->active_sps_id[0] = 0xffffffff;
      p_Vid->active_sps_id[1] = 0xffffffff;
      pvVar9 = mpp_mem_pool_init_f("init_vid_ctx",0xe0);
      p_Vid->pic_st = pvVar9;
    }
    pvVar4 = mpp_osal_calloc("init_dec_ctx",0x19b8);
    *(void **)decoder = pvVar4;
    if (pvVar4 == (void *)0x0) {
      if ((h264d_debug & 1) != 0) {
        pcVar11 = "malloc buffer error(%d).\n";
        uVar13 = 0x103;
        goto LAB_00189b01;
      }
    }
    else {
      *(void **)((long)decoder + 8) = pvVar4;
      *(long *)((long)decoder + 0x10) = (long)pvVar4 + 0x460;
      *(long *)((long)decoder + 0x18) = (long)pvVar4 + 0x960;
      *(long *)((long)decoder + 0x20) = (long)pvVar4 + 0xae0;
      *(long *)((long)decoder + 0x28) = (long)pvVar4 + 0xc60;
      *(void **)((long)pvVar4 + 0x19b0) = decoder;
      *(undefined8 *)((long)pvVar4 + 0x197c) = 0x14;
      *(undefined4 *)((long)pvVar4 + 0x1998) = 0x200000;
      pvVar10 = mpp_osal_calloc("init_dxva_ctx",0xbe0);
      *(void **)((long)pvVar4 + 0x1988) = pvVar10;
      if (pvVar10 == (void *)0x0) {
        uVar13 = 0xdf;
      }
      else {
        pvVar10 = mpp_osal_malloc("init_dxva_ctx",(ulong)*(uint *)((long)pvVar4 + 0x1998));
        *(void **)((long)pvVar4 + 0x1990) = pvVar10;
        pvVar10 = mpp_osal_calloc("init_dxva_ctx",0xf0);
        *(void **)((long)pvVar4 + 0x19a8) = pvVar10;
        if (pvVar10 != (void *)0x0 && *(long *)((long)pvVar4 + 0x1990) != 0) {
          *(long *)((long)decoder + 0x30) = *decoder + 0xde0;
          lVar15 = *(long *)((long)decoder + 8);
          lVar16 = 0;
          lVar14 = 0;
          do {
            reset_dpb_mark((H264_DpbMark_t *)(lVar15 + lVar16));
            lVar15 = *(long *)((long)decoder + 8);
            *(char *)(lVar15 + 3 + lVar16) = (char)lVar14;
            lVar14 = lVar14 + 1;
            lVar16 = lVar16 + 0x20;
          } while (lVar14 != 0x23);
          mpp_buf_slot_setup(*(MppBufSlots *)((long)decoder + 0x68),0x23);
          mpp_packet_init((MppPacket *)((long)decoder + 0x90),
                          *(void **)(*(long *)((long)decoder + 0x30) + 0xbb0),
                          (ulong)*(uint *)(*(long *)((long)decoder + 0x30) + 3000));
          if (*(long *)((long)decoder + 0x90) != 0) {
            *(undefined8 *)((long)decoder + 0x50) = 2;
            *(undefined4 *)((long)decoder + 0x58) = 2;
            *(undefined1 *)((long)decoder + 0x5c) = 0;
            *(undefined4 *)((long)decoder + 0xb0) = 0xffffffff;
            *(undefined8 *)((long)decoder + 0xb8) = 0;
            *(undefined8 *)((long)decoder + 0xc0) = 0;
            *(undefined8 *)((long)decoder + 0xc4) = 0;
            *(undefined8 *)((long)decoder + 0xcc) = 0;
            *(undefined4 *)((long)decoder + 0xb4) =
                 *(undefined4 *)(*(long *)((long)decoder + 0x78) + 0x1c);
            mpp_env_get_u32("force_fast_play_mode",
                            (RK_U32 *)(*(long *)((long)decoder + 0x48) + 0xd0c),
                            *(RK_U32 *)(*(long *)((long)decoder + 0x78) + 0x38));
            if ((h264d_debug & 8) != 0) {
              _mpp_log_l(4,"h264d_api","fast play mode: %d",(char *)0x0,
                         (ulong)*(uint *)(*(long *)((long)decoder + 0x48) + 0xd0c));
            }
            *(undefined4 *)(*(long *)((long)decoder + 0x48) + 0xd10) = 0;
            mpp_slots_set_prop(*(MppBufSlots *)((long)decoder + 0x68),SLOTS_WIDTH_ALIGN,
                               rkv_mblock_width_align);
            return MPP_OK;
          }
          if ((h264d_debug & 1) != 0) {
            pcVar11 = "malloc buffer error(%d).\n";
            uVar13 = 0x115;
            goto LAB_00189b01;
          }
          goto LAB_00189b08;
        }
        uVar13 = 0xe2;
      }
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_api","malloc buffer error(%d).\n",(char *)0x0,uVar13);
      }
      if ((h264d_debug & 4) != 0) {
        pcVar11 = "Function error(%d).\n";
        uVar13 = 0x10b;
LAB_00189b01:
        _mpp_log_l(4,"h264d_api",pcVar11,(char *)0x0,uVar13);
      }
    }
LAB_00189b08:
    free_dec_ctx((H264_DecCtx_t *)decoder);
    if ((h264d_debug & 4) == 0) goto LAB_001895c3;
    pcVar11 = "Function error(%d).\n";
    uVar13 = 0x164;
  }
LAB_001895bc:
  _mpp_log_l(4,"h264d_api",pcVar11,(char *)0x0,uVar13);
LAB_001895c3:
  h264d_deinit(decoder);
  return MPP_ERR_MALLOC;
}

Assistant:

MPP_RET h264d_init(void *decoder, ParserCfg *init)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec = (H264_DecCtx_t *)decoder;
    INP_CHECK(ret, !p_Dec);
    memset(p_Dec, 0, sizeof(H264_DecCtx_t));

    mpp_env_get_u32("h264d_debug", &h264d_debug, H264D_DBG_ERROR);

    //!< get init frame_slots and packet_slots
    p_Dec->frame_slots  = init->frame_slots;
    p_Dec->packet_slots = init->packet_slots;
    p_Dec->cfg = init->cfg;
    mpp_frame_init(&p_Dec->curframe);
    //!< malloc decoder buffer
    p_Dec->p_Inp = mpp_calloc(H264dInputCtx_t, 1);
    p_Dec->p_Cur = mpp_calloc(H264dCurCtx_t, 1);
    p_Dec->p_Vid = mpp_calloc(H264dVideoCtx_t, 1);
    MEM_CHECK(ret, p_Dec->p_Inp && p_Dec->p_Cur && p_Dec->p_Vid);
    p_Dec->p_Inp->p_Dec = p_Dec;
    p_Dec->p_Inp->p_Cur = p_Dec->p_Cur;
    p_Dec->p_Inp->p_Vid = p_Dec->p_Vid;

    p_Dec->p_Cur->p_Dec = p_Dec;
    p_Dec->p_Cur->p_Inp = p_Dec->p_Inp;
    p_Dec->p_Cur->p_Vid = p_Dec->p_Vid;

    p_Dec->p_Vid->p_Dec = p_Dec;
    p_Dec->p_Vid->p_Inp = p_Dec->p_Inp;
    p_Dec->p_Vid->p_Cur = p_Dec->p_Cur;
    p_Dec->hw_info      = init->hw_info;
    FUN_CHECK(ret = init_input_ctx(p_Dec->p_Inp, init));
    FUN_CHECK(ret = init_cur_ctx(p_Dec->p_Cur));
    FUN_CHECK(ret = init_vid_ctx(p_Dec->p_Vid));
    FUN_CHECK(ret = init_dec_ctx(p_Dec));
    p_Dec->immediate_out = p_Dec->cfg->base.fast_out;
    mpp_env_get_u32("force_fast_play_mode", &p_Dec->p_Vid->dpb_fast_out,
                    p_Dec->cfg->base.enable_fast_play);
    H264D_LOG("fast play mode: %d", p_Dec->p_Vid->dpb_fast_out);
    p_Dec->p_Vid->dpb_first_fast_played = 0;
    mpp_slots_set_prop(p_Dec->frame_slots, SLOTS_WIDTH_ALIGN, rkv_mblock_width_align);
__RETURN:
    return ret = MPP_OK;
__FAILED:
    h264d_deinit(decoder);

    return ret;
}